

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::TwoLevelIterator
          (TwoLevelIterator *this,Iterator *index_iter,BlockFunction block_function,void *arg,
          ReadOptions *options)

{
  bool bVar1;
  undefined6 uVar2;
  ReadOptions *options_local;
  void *arg_local;
  BlockFunction block_function_local;
  Iterator *index_iter_local;
  TwoLevelIterator *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_001e5760;
  this->block_function_ = block_function;
  this->arg_ = arg;
  bVar1 = options->fill_cache;
  uVar2 = *(undefined6 *)&options->field_0x2;
  (this->options_).verify_checksums = options->verify_checksums;
  (this->options_).fill_cache = bVar1;
  *(undefined6 *)&(this->options_).field_0x2 = uVar2;
  (this->options_).snapshot = options->snapshot;
  Status::Status(&this->status_);
  IteratorWrapper::IteratorWrapper(&this->index_iter_,index_iter);
  IteratorWrapper::IteratorWrapper(&this->data_iter_,(Iterator *)0x0);
  std::__cxx11::string::string((string *)&this->data_block_handle_);
  return;
}

Assistant:

TwoLevelIterator::TwoLevelIterator(Iterator* index_iter,
                                   BlockFunction block_function, void* arg,
                                   const ReadOptions& options)
    : block_function_(block_function),
      arg_(arg),
      options_(options),
      index_iter_(index_iter),
      data_iter_(nullptr) {}